

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

bool P_Move(AActor *actor)

{
  DVector3 *pDVar1;
  byte *pbVar2;
  int iVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  AActor *this;
  sector_t *sec;
  ASectorAction *pAVar7;
  line_t_conflict *line;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  byte bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  double friction;
  double local_160;
  TAngle<double> local_158;
  undefined8 uStack_150;
  DVector3 local_148;
  double local_130;
  double local_128;
  double dStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  TVector2<double> local_d8;
  FCheckPosition local_c8;
  
  dVar28 = actor->Speed;
  local_160 = 0.90625;
  uVar14 = (actor->flags2).Value;
  bVar18 = 1;
  if ((uVar14 & 8) != 0) goto LAB_003efa59;
  if ((actor->movedir == 8) ||
     ((((((actor->flags).Value & 0x200) == 0 && (((actor->flags6).Value & 0x400) == 0)) &&
       ((uVar14 >> 0xb & 1) == 0)) &&
      (dVar4 = (actor->__Pos).Z, actor->floorz <= dVar4 && dVar4 != actor->floorz)))) {
    bVar18 = 0;
    goto LAB_003efa59;
  }
  if (7 < actor->movedir) {
    I_Error("Weird actor->movedir!");
  }
  this = (actor->target).field_0.p;
  if (this == (AActor *)0x0) {
LAB_003ef3d0:
    iVar15 = 0;
  }
  else {
    if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (actor->target).field_0.p = (AActor *)0x0;
      goto LAB_003ef3d0;
    }
    iVar15 = 0;
    if ((((actor->flags6).Value & 0x800) != 0) && (bVar12 = AActor::IsFriend(this,actor), !bVar12))
    {
      iVar15 = 0;
      dVar4 = AActor::Distance2D(actor,this,false);
      if (dVar4 < 144.0) {
        uVar14 = FRandom::GenRand32(&pr_dropoff);
        iVar15 = (uint)((uVar14 & 0xff) < 0xeb) * 2;
      }
    }
  }
  if ((compatflags.Value._3_1_ & 1) == 0) {
    local_e8 = 0;
    uStack_e4 = 0x3fa00000;
    uStack_e0 = 0;
    uStack_dc = 0;
  }
  else {
    dVar4 = P_GetMoveFactor(actor,&local_160);
    local_e8 = SUB84(dVar4,0);
    uStack_e4 = (undefined4)((ulong)dVar4 >> 0x20);
    uStack_e0 = extraout_XMM0_Dc;
    uStack_dc = extraout_XMM0_Dd;
    if (local_160 < 0.90625) {
      dVar28 = dVar28 * ((0.03125 - dVar4) * -0.5 + 0.03125) * 32.0;
      if ((dVar28 == 0.0) && (!NAN(dVar28))) {
        dVar28 = actor->Speed;
      }
    }
  }
  local_128 = xspeed[actor->movedir] * dVar28;
  dStack_120 = yspeed[actor->movedir] * dVar28;
  dVar28 = actor->radius + -1.0;
  iVar17 = 1;
  if (0.0 < dVar28) {
    dVar4 = ABS(dStack_120);
    if (dVar4 < ABS(local_128)) {
      dVar4 = ABS(local_128);
    }
    if (dVar28 < dVar4) {
      iVar17 = (int)(dVar4 / dVar28) + 1;
    }
  }
  pDVar1 = &actor->__Pos;
  dVar28 = pDVar1->X;
  dVar4 = (actor->__Pos).Y;
  auVar11._0_8_ = pDVar1->X;
  auVar11._8_8_ = pDVar1->Y;
  local_c8.LastRipped.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_c8.LastRipped,1);
  local_c8.DoRipping = false;
  local_c8.PushTime = 0;
  local_c8.FromPMove = true;
  local_158.Degrees = local_128;
  uStack_150 = dStack_120;
  if (iVar17 < 1) {
    bVar12 = true;
  }
  else {
    dVar27 = (actor->Angles).Yaw.Degrees;
    dVar9 = 1.0 / (double)iVar17;
    local_f8._8_4_ = SUB84(dVar9,0);
    local_f8._0_8_ = dVar9;
    local_f8._12_4_ = (int)((ulong)dVar9 >> 0x20);
    bVar12 = false;
    iVar16 = 1;
    local_108 = auVar11;
    do {
      dVar10 = (double)iVar16;
      local_118._8_4_ = SUB84(dVar10,0);
      local_118._0_8_ = dVar10;
      local_118._12_4_ = (int)((ulong)dVar10 >> 0x20);
      dVar9 = uStack_150 * dVar10 * (double)local_f8._8_8_ + (double)local_108._8_8_;
      local_148.Y._0_4_ = SUB84(dVar9,0);
      local_148.X = local_158.Degrees * dVar10 * (double)local_f8._0_8_ + (double)local_108._0_8_;
      local_148.Y._4_4_ = (int)((ulong)dVar9 >> 0x20);
      bVar13 = P_TryMove(actor,(DVector2 *)&local_148,iVar15,(secplane_t *)0x0,&local_c8,false);
      if (!bVar13) break;
      if (iVar17 != 1) {
        uVar5 = (actor->__Pos).X;
        uVar6 = (actor->__Pos).Y;
        uVar19 = (undefined4)uVar5;
        uVar20 = (undefined4)((ulong)uVar5 >> 0x20);
        uVar21 = (undefined4)uVar6;
        uVar22 = (undefined4)((ulong)uVar6 >> 0x20);
        if (((double)uVar5 == local_148.X) && (!NAN((double)uVar5) && !NAN(local_148.X))) {
          if (((double)uVar6 == local_148.Y) && (!NAN((double)uVar6) && !NAN(local_148.Y)))
          goto LAB_003ef6c8;
        }
        dVar9 = (double)SUB84(((actor->Angles).Yaw.Degrees - dVar27) * 11930464.711111112 +
                              6755399441055744.0,0) * 8.381903171539307e-08;
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          local_130 = dVar9;
          TVector2<double>::Rotated<double>(&local_d8,&local_158);
          local_158.Degrees._4_4_ = local_d8.X._4_4_;
          local_158.Degrees._0_4_ = local_d8.X._0_4_;
          uStack_150 = (double)CONCAT44(local_d8.Y._4_4_,local_d8.Y._0_4_);
          dVar27 = (actor->Angles).Yaw.Degrees;
          uVar19 = *(undefined4 *)&(actor->__Pos).X;
          uVar20 = *(undefined4 *)((long)&(actor->__Pos).X + 4);
          uVar21 = *(undefined4 *)&(actor->__Pos).Y;
          uVar22 = *(undefined4 *)((long)&(actor->__Pos).Y + 4);
          uVar23 = local_d8.X._0_4_;
          uVar24 = local_d8.X._4_4_;
          uVar25 = local_d8.Y._0_4_;
          uVar26 = local_d8.Y._4_4_;
        }
        else {
          uVar23 = local_158.Degrees._0_4_;
          uVar24 = local_158.Degrees._4_4_;
          uVar25 = (undefined4)uStack_150;
          uVar26 = uStack_150._4_4_;
        }
        dVar9 = (double)CONCAT44(uVar22,uVar21) -
                (double)CONCAT44(uVar26,uVar25) * (double)local_118._8_8_ * (double)local_f8._8_8_;
        local_108._8_4_ = SUB84(dVar9,0);
        local_108._0_8_ =
             (double)CONCAT44(uVar20,uVar19) -
             (double)CONCAT44(uVar24,uVar23) * (double)local_118._0_8_ * (double)local_f8._0_8_;
        local_108._12_4_ = (int)((ulong)dVar9 >> 0x20);
      }
LAB_003ef6c8:
      iVar3 = (1 - iVar17) + iVar16;
      bVar12 = iVar17 <= iVar16;
      iVar16 = iVar16 + 1;
    } while (iVar3 != 1);
  }
  if (nomonsterinterpolation.Value == true) {
    (actor->Prev).Z = (actor->__Pos).Z;
    dVar27 = (actor->__Pos).Y;
    (actor->Prev).X = (actor->__Pos).X;
    (actor->Prev).Y = dVar27;
    (actor->PrevAngles).Roll.Degrees = (actor->Angles).Roll.Degrees;
    dVar27 = (actor->Angles).Yaw.Degrees;
    (actor->PrevAngles).Pitch.Degrees = (actor->Angles).Pitch.Degrees;
    (actor->PrevAngles).Yaw.Degrees = dVar27;
    if (actor->Sector == (sector_t *)0x0) {
      iVar15 = 0;
    }
    else {
      iVar15 = actor->Sector->PortalGroup;
    }
    actor->PrevPortalGroup = iVar15;
  }
  if ((bool)(0.90625 < local_160 & bVar12)) {
    AActor::SetOrigin(actor,dVar28,dVar4,(actor->__Pos).Z,false);
    dVar4 = (double)CONCAT44(uStack_e4,local_e8) * 8.0;
    dVar28 = (actor->Vel).X + dVar4 * local_128;
    dVar4 = (actor->Vel).Y + dVar4 * dStack_120;
    auVar8._8_4_ = SUB84(dVar4,0);
    auVar8._0_8_ = dVar28;
    auVar8._12_4_ = (int)((ulong)dVar4 >> 0x20);
    (actor->Vel).X = dVar28;
    (actor->Vel).Y = (double)auVar8._8_8_;
  }
  if (bVar12) {
    if ((((actor->flags).Value & 0x200) == 0) && (((actor->flags6).Value & 0x400) == 0)) {
      dVar28 = (actor->__Pos).Z;
      dVar4 = actor->floorz;
      if ((dVar4 < dVar28) &&
         ((((actor->flags2).Value & 0x800) == 0 && (dVar28 <= actor->MaxStepHeight + dVar4)))) {
        (actor->__Pos).Z = dVar4;
        bVar12 = P_TestMobjZ(actor,true,(AActor **)0x0);
        if (bVar12) {
          sec = actor->floorsector;
          pAVar7 = (sec->SecActTarget).field_0.p;
          if (pAVar7 != (ASectorAction *)0x0) {
            if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
              dVar28 = actor->floorz;
              AActor::PosRelative(&local_148,actor,sec);
              dVar4 = ((sec->floorplane).normal.Y * local_148.Y +
                      (sec->floorplane).D + (sec->floorplane).normal.X * local_148.X) *
                      (sec->floorplane).negiC;
              if ((dVar28 == dVar4) && (!NAN(dVar28) && !NAN(dVar4))) {
                ASectorAction::TriggerAction((actor->floorsector->SecActTarget).field_0.p,actor,4);
              }
            }
            else {
              (sec->SecActTarget).field_0.p = (ASectorAction *)0x0;
            }
          }
          P_CheckFor3DFloorHit(actor,(actor->__Pos).Z);
        }
        else {
          (actor->__Pos).Z = dVar28;
        }
      }
    }
    pbVar2 = (byte *)((long)&(actor->flags).Value + 2);
    *pbVar2 = *pbVar2 & 0xdf;
LAB_003efa49:
    bVar18 = 1;
  }
  else {
    if (((((actor->flags6).Value & 0x400) != 0) || (((actor->flags).Value & 0x4000) != 0)) &&
       (local_c8.floatok == true)) {
      dVar28 = (actor->__Pos).Z;
      (actor->__Pos).Z =
           (double)(~-(ulong)(dVar28 < local_c8.floorz) & (ulong)-actor->FloatSpeed |
                   (ulong)actor->FloatSpeed & -(ulong)(dVar28 < local_c8.floorz)) + dVar28;
      bVar12 = P_TestMobjZ(actor,true,(AActor **)0x0);
      if (bVar12) {
        pbVar2 = (byte *)((long)&(actor->flags).Value + 2);
        *pbVar2 = *pbVar2 | 0x20;
        goto LAB_003efa49;
      }
      (actor->__Pos).Z = dVar28;
    }
    if (spechit.Count != 0) {
      actor->movedir = '\b';
      if (((actor->flags6).Value & 0x10000) == 0) {
        bVar18 = 0;
        do {
          spechit.Count = spechit.Count - 1;
          line = (line_t_conflict *)spechit.Array[spechit.Count].line;
          if (((((actor->flags4).Value & 0x200) != 0) &&
              (bVar12 = P_ActivateLine(line,actor,0,2,(DVector3 *)0x0), bVar12)) ||
             ((((actor->flags2).Value & 0x400000) != 0 &&
              (bVar12 = P_ActivateLine(line,actor,0,0x10,(DVector3 *)0x0), bVar12)))) {
            bVar18 = bVar18 | (line != (line_t_conflict *)actor->BlockingLine) + 1U;
          }
        } while (spechit.Count != 0);
        if (bVar18 != 0) {
          uVar14 = FRandom::GenRand32(&pr_opendoor);
          bVar18 = bVar18 ^ 0xca < (uVar14 & 0xff);
          goto LAB_003efa4c;
        }
      }
      else {
        spechit.Count = 0;
      }
    }
    bVar18 = 0;
  }
LAB_003efa4c:
  M_Free(local_c8.LastRipped.Nodes);
LAB_003efa59:
  return (bool)(bVar18 & 1);
}

Assistant:

bool P_Move (AActor *actor)
{

	double tryx, tryy, deltax, deltay, origx, origy;
	bool try_ok;
	double speed = actor->Speed;
	double movefactor = ORIG_FRICTION_FACTOR;
	double friction = ORIG_FRICTION;
	int dropoff = 0;

	if (actor->flags2 & MF2_BLASTED)
	{
		return true;
	}

	if (actor->movedir == DI_NODIR)
	{
		return false;
	}

	// [RH] Walking actors that are not on the ground cannot walk. We don't
	// want to yank them to the ground here as Doom did, since that makes
	// it difficult to thrust them vertically in a reasonable manner.
	// [GZ] Let jumping actors jump.
	if (!((actor->flags & MF_NOGRAVITY) || (actor->flags6 & MF6_CANJUMP))
		&& actor->Z() > actor->floorz && !(actor->flags2 & MF2_ONMOBJ))
	{
		return false;
	}

	if ((unsigned)actor->movedir >= 8)
		I_Error ("Weird actor->movedir!");

	// killough 10/98: allow dogs to drop off of taller ledges sometimes.
	// dropoff==1 means always allow it, dropoff==2 means only up to 128 high,
	// and only if the target is immediately on the other side of the line.
	AActor *target = actor->target;

	if ((actor->flags6 & MF6_JUMPDOWN) && target &&
			!(target->IsFriend(actor)) &&
			actor->Distance2D(target) < 144 &&
			pr_dropoff() < 235)
	{
		dropoff = 2;
	}

	// [RH] I'm not so sure this is such a good idea
	// [GZ] That's why it's compat-optioned.
	if (compatflags & COMPATF_MBFMONSTERMOVE)
	{
		// killough 10/98: make monsters get affected by ice and sludge too:
		movefactor = P_GetMoveFactor (actor, &friction);

		if (friction < ORIG_FRICTION)
		{ // sludge
			speed = speed * ((ORIG_FRICTION_FACTOR - (ORIG_FRICTION_FACTOR-movefactor)/2)) / ORIG_FRICTION_FACTOR;
			if (speed == 0)
			{ // always give the monster a little bit of speed
				speed = actor->Speed;
			}
		}
	}

	tryx = (origx = actor->X()) + (deltax = (speed * xspeed[actor->movedir]));
	tryy = (origy = actor->Y()) + (deltay = (speed * yspeed[actor->movedir]));

	// Like P_XYMovement this should do multiple moves if the step size is too large

	double maxmove = actor->radius - 1;
	int steps = 1;

	if (maxmove > 0)
	{ 
		const double xspeed = fabs (deltax);
		const double yspeed = fabs (deltay);

		if (xspeed > yspeed)
		{
			if (xspeed > maxmove)
			{
				steps = 1 + int(xspeed / maxmove);
			}
		}
		else
		{
			if (yspeed > maxmove)
			{
				steps = 1 + int(yspeed / maxmove);
			}
		}
	}
	FCheckPosition tm;

	tm.FromPMove = true;

	DVector2 start = { origx, origy };
	DVector2 move = { deltax, deltay };
	DAngle oldangle = actor->Angles.Yaw;

	try_ok = true;
	for (int i = 1; i <= steps; i++)
	{
		DVector2 ptry = start + move * i / steps;
		// killough 3/15/98: don't jump over dropoffs:
		try_ok = P_TryMove(actor, ptry, dropoff, NULL, tm);
		if (!try_ok) break;

		// Handle portal transitions just like P_XYMovement.
		if (steps > 1 && actor->Pos().XY() != ptry)
		{
			DAngle anglediff = deltaangle(oldangle, actor->Angles.Yaw);

			if (anglediff != 0)
			{
				move = move.Rotated(anglediff);
				oldangle = actor->Angles.Yaw;
			}
			start = actor->Pos() - move * i / steps;
		}
	}

	// [GrafZahl] Interpolating monster movement as it is done here just looks bad
	// so make it switchable
	if (nomonsterinterpolation)
	{
		actor->ClearInterpolation();
	}

	if (try_ok && friction > ORIG_FRICTION)
	{
		actor->SetOrigin(origx, origy, actor->Z(), false);
		movefactor *= 1.f / ORIG_FRICTION_FACTOR / 4;
		actor->Vel.X += deltax * movefactor;
		actor->Vel.Y += deltay * movefactor;
	}

	// [RH] If a walking monster is no longer on the floor, move it down
	// to the floor if it is within MaxStepHeight, presuming that it is
	// actually walking down a step.
	if (try_ok &&
		!((actor->flags & MF_NOGRAVITY) || (actor->flags6 & MF6_CANJUMP))
			&& actor->Z() > actor->floorz && !(actor->flags2 & MF2_ONMOBJ))
	{
		if (actor->Z() <= actor->floorz + actor->MaxStepHeight)
		{
			double savedz = actor->Z();
			actor->SetZ(actor->floorz);
			// Make sure that there isn't some other actor between us and
			// the floor we could get stuck in. The old code did not do this.
			if (!P_TestMobjZ(actor))
			{
				actor->SetZ(savedz);
			}
			else
			{ // The monster just hit the floor, so trigger any actions.
				if (actor->floorsector->SecActTarget != NULL &&
					actor->floorz == actor->floorsector->floorplane.ZatPoint(actor->PosRelative(actor->floorsector)))
				{
					actor->floorsector->SecActTarget->TriggerAction(actor, SECSPAC_HitFloor);
				}
				P_CheckFor3DFloorHit(actor, actor->Z());
			}
		}
	}

	if (!try_ok)
	{
		if (((actor->flags6 & MF6_CANJUMP)||(actor->flags & MF_FLOAT)) && tm.floatok)
		{ // must adjust height
			double savedz = actor->Z();

			if (actor->Z() < tm.floorz)
				actor->AddZ(actor->FloatSpeed);
			else
				actor->AddZ(-actor->FloatSpeed);


			// [RH] Check to make sure there's nothing in the way of the float
			if (P_TestMobjZ (actor))
			{
				actor->flags |= MF_INFLOAT;
				return true;
			}
			actor->SetZ(savedz);
		}

		if (!spechit.Size ())
		{
			return false;
		}

		// open any specials
		actor->movedir = DI_NODIR;

		// if the special is not a door that can be opened, return false
		//
		// killough 8/9/98: this is what caused monsters to get stuck in
		// doortracks, because it thought that the monster freed itself
		// by opening a door, even if it was moving towards the doortrack,
		// and not the door itself.
		//
		// killough 9/9/98: If a line blocking the monster is activated,
		// return true 90% of the time. If a line blocking the monster is
		// not activated, but some other line is, return false 90% of the
		// time. A bit of randomness is needed to ensure it's free from
		// lockups, but for most cases, it returns the correct result.
		//
		// Do NOT simply return false 1/4th of the time (causes monsters to
		// back out when they shouldn't, and creates secondary stickiness).

		spechit_t spec;
		int good = 0;
		
		if (!(actor->flags6 & MF6_NOTRIGGER))
		{
			while (spechit.Pop (spec))
			{
				// [RH] let monsters push lines, as well as use them
				if (((actor->flags4 & MF4_CANUSEWALLS) && P_ActivateLine (spec.line, actor, 0, SPAC_Use)) ||
					((actor->flags2 & MF2_PUSHWALL) && P_ActivateLine (spec.line, actor, 0, SPAC_Push)))
				{
					good |= spec.line == actor->BlockingLine ? 1 : 2;
				}
			}
		}
		else spechit.Clear();
		return good && ((pr_opendoor() >= 203) ^ (good & 1));
	}
	else
	{
		actor->flags &= ~MF_INFLOAT;
	}
	return true; 
}